

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSeq.c
# Opt level: O1

int Cec_ManCheckNonTrivialCands(Gia_Man_t *pAig)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  Vec_Int_t *pVVar5;
  ulong uVar6;
  Gia_Obj_t *pGVar7;
  
  if (pAig->pReprs == (Gia_Rpr_t *)0x0) {
    iVar3 = 0;
  }
  else {
    pVVar5 = pAig->vCos;
    uVar6 = (ulong)(uint)pVVar5->nSize;
    if (pAig->nRegs < pVVar5->nSize) {
      lVar4 = 0;
      do {
        if ((int)uVar6 <= lVar4) goto LAB_0064ead2;
        iVar3 = pVVar5->pArray[lVar4];
        if (((long)iVar3 < 0) || (pAig->nObjs <= iVar3)) goto LAB_0064eab3;
        if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar7 = pAig->pObjs + iVar3;
        *(ulong *)(pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff)) =
             *(ulong *)(pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff)) | 0x40000000;
        lVar4 = lVar4 + 1;
        pVVar5 = pAig->vCos;
        uVar6 = (ulong)pVVar5->nSize;
      } while (lVar4 < (long)(uVar6 - (long)pAig->nRegs));
    }
    iVar3 = 0;
    if ((0 < pAig->nObjs) && (pGVar7 = pAig->pObjs, pGVar7 != (Gia_Obj_t *)0x0)) {
      uVar6 = 0;
      do {
        uVar1 = *(uint *)pGVar7;
        if ((((uVar1 >> 0x1e & 1) == 0) &&
            ((~uVar1 & 0x9fffffff) == 0 || -1 < (int)uVar1 && (~uVar1 & 0x1fffffff) != 0)) &&
           ((~(uint)pAig->pReprs[uVar6] & 0xfffffff) != 0)) {
          iVar3 = 1;
          goto LAB_0064ea46;
        }
        uVar6 = uVar6 + 1;
        pGVar7 = pGVar7 + 1;
      } while ((uint)pAig->nObjs != uVar6);
      iVar3 = 0;
    }
LAB_0064ea46:
    pVVar5 = pAig->vCos;
    uVar6 = (ulong)(uint)pVVar5->nSize;
    if (pAig->nRegs < pVVar5->nSize) {
      lVar4 = 0;
      do {
        if ((int)uVar6 <= lVar4) {
LAB_0064ead2:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar2 = pVVar5->pArray[lVar4];
        if (((long)iVar2 < 0) || (pAig->nObjs <= iVar2)) {
LAB_0064eab3:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (pAig->pObjs == (Gia_Obj_t *)0x0) {
          return iVar3;
        }
        pGVar7 = pAig->pObjs + iVar2;
        *(ulong *)(pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff)) =
             *(ulong *)(pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff)) &
             0xffffffffbfffffff;
        lVar4 = lVar4 + 1;
        pVVar5 = pAig->vCos;
        uVar6 = (ulong)pVVar5->nSize;
      } while (lVar4 < (long)(uVar6 - (long)pAig->nRegs));
    }
  }
  return iVar3;
}

Assistant:

int Cec_ManCheckNonTrivialCands( Gia_Man_t * pAig )
{
    Gia_Obj_t * pObj;
    int i, RetValue = 0;
    if ( pAig->pReprs == NULL )
        return 0;
    // label internal nodes driving POs
    Gia_ManForEachPo( pAig, pObj, i )
        Gia_ObjFanin0(pObj)->fMark0 = 1;
    // check if there are non-labled equivs
    Gia_ManForEachObj( pAig, pObj, i )
        if ( Gia_ObjIsCand(pObj) && !pObj->fMark0 && Gia_ObjRepr(pAig, i) != GIA_VOID )
        {
            RetValue = 1;
            break;
        }
    // clean internal nodes driving POs
    Gia_ManForEachPo( pAig, pObj, i )
        Gia_ObjFanin0(pObj)->fMark0 = 0;
    return RetValue;
}